

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<bool> *target,string_view name,
          string_view value)

{
  int iVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  ushort uVar2;
  size_type __rlen;
  ushort uVar3;
  ushort uVar4;
  string_view fmt;
  format_args args;
  string local_78;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0x100;
  uVar2 = 1;
  uVar4 = 0x100;
  if (value._M_len != 0) {
    uVar4 = uVar3;
    if (value._M_len == 5) {
      iVar1 = bcmp(value._M_str,"False",5);
      if ((iVar1 == 0) || (iVar1 = bcmp(value._M_str,"false",5), iVar1 == 0)) {
        uVar2 = 0;
        goto LAB_001b0fa6;
      }
    }
    else if ((value._M_len == 4) &&
            ((iVar1 = bcmp(value._M_str,"True",4), uVar2 = 1, iVar1 == 0 ||
             (iVar1 = bcmp(value._M_str,"true",4), iVar1 == 0)))) goto LAB_001b0fa6;
    local_58 = value._M_str;
    local_50 = value._M_len;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x2c;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    local_48 = name._M_str;
    local_40 = name._M_len;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_78,(v9 *)"invalid value \'{}\' for boolean argument \'{}\'",fmt,args);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    uVar2 = 0;
    uVar4 = 0;
  }
LAB_001b0fa6:
  (target->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload_base<bool>)(uVar4 | uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, string_view name,
                                     string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}